

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls-test.c++:1215:23)>
::getImpl(SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_test_c__:1215:23)>
          *this,ExceptionOrValue *output)

{
  Fault local_3b0;
  DebugComparison<unsigned_long_&,_int> _kjCondition;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_380;
  ExceptionOr<kj::_::Void> local_378;
  ExceptionOr<unsigned_long> depResult;
  
  depResult.super_ExceptionOrValue.exception.ptr.isSet = false;
  depResult.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&depResult.super_ExceptionOrValue);
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    local_378.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.file;
    local_378.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1._32_8_;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         (char *)0x0;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ = 0;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         (char *)0x0;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_378.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),0x105);
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0
    ;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         (Detail *)0x0;
    local_378.value.ptr.isSet = false;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_378);
  }
  else {
    if (depResult.value.ptr.isSet != true) goto LAB_00392e5c;
    _kjCondition.left = (unsigned_long *)&local_380;
    local_380 = depResult.value.ptr.field_1;
    _kjCondition.right = 0;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = depResult.value.ptr.field_1.value == 0;
    if (!_kjCondition.result) {
      Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[13]>
                (&local_3b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls-test.c++"
                 ,0x4c0,FAILED,"amount == 0","_kjCondition,\"expected EOF\"",&_kjCondition,
                 (char (*) [13])"expected EOF");
      Debug::Fault::fatal(&local_3b0);
    }
    local_378.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_378.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_378);
  }
  if (local_378.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_378.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_00392e5c:
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&depResult.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }